

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

Namespace * soul::AST::createRootNamespace(Allocator *a)

{
  Namespace *pNVar1;
  string_view newString;
  Identifier rootNamespaceName;
  CodeLocation local_38;
  Context local_28;
  Identifier local_10;
  
  newString._M_str = "_root";
  newString._M_len = 5;
  local_10 = Identifier::Pool::get(&a->identifiers,newString);
  local_38.sourceCode.object = (SourceCodeText *)0x0;
  local_38.location.data = (char *)0x0;
  local_28.location.sourceCode.object = (SourceCodeText *)0x0;
  local_28.location.location.data = (char *)0x0;
  local_28.parentScope = (Scope *)0x0;
  pNVar1 = PoolAllocator::
           allocate<soul::AST::Namespace,soul::CodeLocation,soul::AST::Context,soul::Identifier&>
                     (&a->pool,&local_38,&local_28,&local_10);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_28.location.sourceCode.object);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_38.sourceCode.object);
  return pNVar1;
}

Assistant:

static Namespace& createRootNamespace (Allocator& a)
    {
        auto rootNamespaceName = a.get (Program::getRootNamespaceName());
        return a.allocate<Namespace> (CodeLocation(), Context(), rootNamespaceName);
    }